

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

void __kmp_dist_get_bounds<unsigned_long_long>
               (ident_t *loc,kmp_int32 gtid,kmp_int32 *plastiter,unsigned_long_long *plower,
               unsigned_long_long *pupper,signed_t_conflict incr)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong *in_RCX;
  uint *in_RDX;
  int in_ESI;
  ulong *in_R8;
  ulong in_R9;
  unsigned_long_long upper;
  unsigned_long_long chunk_inc_count;
  UT extras;
  UT chunk;
  kmp_info_t *th;
  kmp_team_t *team;
  UT trip_count;
  kmp_uint32 nteams;
  kmp_uint32 team_id;
  bool local_a2;
  bool local_a1;
  ulong local_98;
  ulong local_88;
  ident_t *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  ulong uVar5;
  
  if (__kmp_env_consistency_check != 0) {
    if (in_R9 == 0) {
      __kmp_error_construct
                ((kmp_i18n_id_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                 (cons_type)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    if ((long)in_R9 < 1) {
      if (*in_R8 <= *in_RCX) goto LAB_0018e2d1;
    }
    else if (*in_RCX <= *in_R8) goto LAB_0018e2d1;
    __kmp_error_construct
              ((kmp_i18n_id_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (cons_type)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
LAB_0018e2d1:
  uVar1 = (__kmp_threads[in_ESI]->th).th_teams_size.nteams;
  uVar2 = (((__kmp_threads[in_ESI]->th).th_team)->t).t_master_tid;
  if (in_R9 == 1) {
    uVar3 = *in_R8 - *in_RCX;
  }
  else if (in_R9 == 0xffffffffffffffff) {
    uVar3 = *in_RCX - *in_R8;
  }
  else if ((long)in_R9 < 1) {
    uVar3 = (*in_RCX - *in_R8) / -in_R9;
  }
  else {
    uVar3 = (*in_R8 - *in_RCX) / in_R9;
  }
  uVar5 = uVar3 + 1;
  if (uVar1 < uVar5) {
    if (__kmp_static == kmp_sch_static_balanced) {
      uVar3 = uVar5 % (ulong)uVar1;
      local_88 = uVar3;
      if (uVar2 < uVar3) {
        local_88 = (ulong)uVar2;
      }
      *in_RCX = in_R9 * ((ulong)uVar2 * (uVar5 / uVar1) + local_88) + *in_RCX;
      local_98 = in_R9;
      if (uVar2 < uVar3) {
        local_98 = 0;
      }
      *in_R8 = (*in_RCX + (uVar5 / uVar1) * in_R9) - local_98;
      if (in_RDX != (uint *)0x0) {
        *in_RDX = (uint)(uVar2 == uVar1 - 1);
      }
    }
    else {
      lVar4 = (uVar5 / uVar1 + (long)(int)(uint)(uVar5 % (ulong)uVar1 != 0)) * in_R9;
      uVar3 = *in_R8;
      *in_RCX = (ulong)uVar2 * lVar4 + *in_RCX;
      *in_R8 = (*in_RCX + lVar4) - in_R9;
      if ((long)in_R9 < 1) {
        if (*in_RCX < *in_R8) {
          *in_R8 = 0;
        }
        if (in_RDX != (uint *)0x0) {
          local_a2 = false;
          if (uVar3 <= *in_RCX) {
            local_a2 = *in_R8 < uVar3 - in_R9;
          }
          *in_RDX = (uint)local_a2;
        }
        if (*in_R8 < uVar3) {
          *in_R8 = uVar3;
        }
      }
      else {
        if (*in_R8 < *in_RCX) {
          *in_R8 = 0xffffffffffffffff;
        }
        if (in_RDX != (uint *)0x0) {
          local_a1 = false;
          if (*in_RCX <= uVar3) {
            local_a1 = uVar3 - in_R9 < *in_R8;
          }
          *in_RDX = (uint)local_a1;
        }
        if (uVar3 < *in_R8) {
          *in_R8 = uVar3;
        }
      }
    }
  }
  else {
    if (uVar2 < uVar5) {
      uVar5 = *in_RCX + uVar2 * in_R9;
      *in_RCX = uVar5;
      *in_R8 = uVar5;
    }
    else {
      *in_RCX = *in_R8 + in_R9;
    }
    if (in_RDX != (uint *)0x0) {
      *in_RDX = (uint)(uVar2 == uVar3);
    }
  }
  return;
}

Assistant:

static void __kmp_dist_get_bounds(ident_t *loc, kmp_int32 gtid,
                                  kmp_int32 *plastiter, T *plower, T *pupper,
                                  typename traits_t<T>::signed_t incr) {
  typedef typename traits_t<T>::unsigned_t UT;
  kmp_uint32 team_id;
  kmp_uint32 nteams;
  UT trip_count;
  kmp_team_t *team;
  kmp_info_t *th;

  KMP_DEBUG_ASSERT(plastiter && plower && pupper);
  KE_TRACE(10, ("__kmpc_dist_get_bounds called (%d)\n", gtid));
#ifdef KMP_DEBUG
  typedef typename traits_t<T>::signed_t ST;
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmpc_dist_get_bounds: T#%%d liter=%%d "
                            "iter=(%%%s, %%%s, %%%s) signed?<%s>\n",
                            traits_t<T>::spec, traits_t<T>::spec,
                            traits_t<ST>::spec, traits_t<T>::spec);
    KD_TRACE(100, (buff, gtid, *plastiter, *plower, *pupper, incr));
    __kmp_str_free(&buff);
  }
#endif

  if (__kmp_env_consistency_check) {
    if (incr == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited, ct_pdo,
                            loc);
    }
    if (incr > 0 ? (*pupper < *plower) : (*plower < *pupper)) {
      // The loop is illegal.
      // Some zero-trip loops maintained by compiler, e.g.:
      //   for(i=10;i<0;++i) // lower >= upper - run-time check
      //   for(i=0;i>10;--i) // lower <= upper - run-time check
      //   for(i=0;i>10;++i) // incr > 0       - compile-time check
      //   for(i=10;i<0;--i) // incr < 0       - compile-time check
      // Compiler does not check the following illegal loops:
      //   for(i=0;i<10;i+=incr) // where incr<0
      //   for(i=10;i>0;i-=incr) // where incr<0
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrIllegal, ct_pdo, loc);
    }
  }
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  KMP_DEBUG_ASSERT(th->th.th_teams_microtask); // we are in the teams construct
  nteams = th->th.th_teams_size.nteams;
  team_id = team->t.t_master_tid;
  KMP_DEBUG_ASSERT(nteams == (kmp_uint32)team->t.t_parent->t.t_nproc);

  // compute global trip count
  if (incr == 1) {
    trip_count = *pupper - *plower + 1;
  } else if (incr == -1) {
    trip_count = *plower - *pupper + 1;
  } else if (incr > 0) {
    // upper-lower can exceed the limit of signed type
    trip_count = (UT)(*pupper - *plower) / incr + 1;
  } else {
    trip_count = (UT)(*plower - *pupper) / (-incr) + 1;
  }

  if (trip_count <= nteams) {
    KMP_DEBUG_ASSERT(
        __kmp_static == kmp_sch_static_greedy ||
        __kmp_static ==
            kmp_sch_static_balanced); // Unknown static scheduling type.
    // only some teams get single iteration, others get nothing
    if (team_id < trip_count) {
      *pupper = *plower = *plower + team_id * incr;
    } else {
      *plower = *pupper + incr; // zero-trip loop
    }
    if (plastiter != NULL)
      *plastiter = (team_id == trip_count - 1);
  } else {
    if (__kmp_static == kmp_sch_static_balanced) {
      UT chunk = trip_count / nteams;
      UT extras = trip_count % nteams;
      *plower +=
          incr * (team_id * chunk + (team_id < extras ? team_id : extras));
      *pupper = *plower + chunk * incr - (team_id < extras ? 0 : incr);
      if (plastiter != NULL)
        *plastiter = (team_id == nteams - 1);
    } else {
      T chunk_inc_count =
          (trip_count / nteams + ((trip_count % nteams) ? 1 : 0)) * incr;
      T upper = *pupper;
      KMP_DEBUG_ASSERT(__kmp_static == kmp_sch_static_greedy);
      // Unknown static scheduling type.
      *plower += team_id * chunk_inc_count;
      *pupper = *plower + chunk_inc_count - incr;
      // Check/correct bounds if needed
      if (incr > 0) {
        if (*pupper < *plower)
          *pupper = traits_t<T>::max_value;
        if (plastiter != NULL)
          *plastiter = *plower <= upper && *pupper > upper - incr;
        if (*pupper > upper)
          *pupper = upper; // tracker C73258
      } else {
        if (*pupper > *plower)
          *pupper = traits_t<T>::min_value;
        if (plastiter != NULL)
          *plastiter = *plower >= upper && *pupper < upper - incr;
        if (*pupper < upper)
          *pupper = upper; // tracker C73258
      }
    }
  }
}